

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int standardize_path(char *fullpath,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char tmpPath [1025];
  char cwd [1025];
  char local_838 [1040];
  char local_428 [1032];
  
  iVar1 = fits_path2url(fullpath,0x401,local_838,status);
  if (iVar1 == 0) {
    if (local_838[0] != '/') {
      fits_get_cwd(local_428,status);
      sVar2 = strlen(local_428);
      sVar3 = strlen(local_838);
      if ((sVar3 + sVar2) - 0x400 < 0xfffffffffffffbff) {
        ffpmsg("Tile name is too long. (standardize_path)");
        *status = 0x68;
        return 0x68;
      }
      sVar2 = strlen(local_428);
      (local_428 + sVar2)[0] = '/';
      (local_428 + sVar2)[1] = '\0';
      strcat(local_428,local_838);
      fits_clean_url(local_428,local_838,status);
    }
    strcpy(fullpath,local_838);
  }
  return *status;
}

Assistant:

int standardize_path(char *fullpath, int* status)
{
   /* Utility function for common operation in fits_already_open 
      fullpath:  I/O string to be standardized. Assume len = FLEN_FILENAME */
    
   char tmpPath[FLEN_FILENAME];
   char cwd [FLEN_FILENAME];
    
   if (fits_path2url(fullpath, FLEN_FILENAME, tmpPath, status))
      return(*status);
   
   if (tmpPath[0] != '/')
   {
      fits_get_cwd(cwd,status);
      if (strlen(cwd) + strlen(tmpPath) + 1 > FLEN_FILENAME-1) {
	    ffpmsg("Tile name is too long. (standardize_path)");
            return(*status = FILE_NOT_OPENED);
      }
      strcat(cwd,"/");
      strcat(cwd,tmpPath);
      fits_clean_url(cwd,tmpPath,status);
   }
   
   strcpy(fullpath, tmpPath);
      
   return (*status);
}